

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::fill_n<fmt::v8::appender,unsigned_long,char>
                   (appender out,unsigned_long count,char *value)

{
  unsigned_long __value;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> *this;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_38;
  char *local_30;
  unsigned_long i;
  char *value_local;
  unsigned_long count_local;
  appender out_local;
  
  i = (unsigned_long)value;
  value_local = (char *)count;
  count_local = (unsigned_long)
                out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  for (local_30 = (char *)0x0; __value = i, local_30 < value_local; local_30 = local_30 + 1) {
    local_38.container = (buffer<char> *)appender::operator++((appender *)&count_local,0);
    this = std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_38);
    std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=(this,(value_type *)__value)
    ;
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)count_local;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}